

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::form::clear(form *this)

{
  pointer ppVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppVar1 = (this->elements_).
             super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->elements_).
                      super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <=
        (ulong)uVar2) break;
    (*(ppVar1[uVar2].first)->_vptr_base_form[3])();
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void form::clear()
{
	for(unsigned int i=0;i<elements_.size();i++) {
		elements_[i].first->clear();
	}
}